

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::tools::ByteBufferTest_test_two_insertion_Test::TestBody
          (ByteBufferTest_test_two_insertion_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  ByteBuffer byte_buffer;
  Message local_58;
  AssertHelper local_50;
  internal local_48 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  ByteBuffer local_38 [48];
  
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(local_38,0xc);
  bidfx_public_api::tools::ByteBuffer::WriteByte((uchar)local_38);
  bidfx_public_api::tools::ByteBuffer::WriteByte((uchar)local_38);
  local_58.ss_.ptr_._0_1_ = 0x61;
  local_50.data_._0_1_ = bidfx_public_api::tools::ByteBuffer::GetNextByte();
  testing::internal::CmpHelperEQ<char,unsigned_char>
            (local_48,"\'a\'","byte_buffer.GetNextByte()",(char *)&local_58,(uchar *)&local_50);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message(&local_58);
    if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0x25,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (CONCAT71(local_58.ss_.ptr_._1_7_,local_58.ss_.ptr_._0_1_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT71(local_58.ss_.ptr_._1_7_,local_58.ss_.ptr_._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_58.ss_.ptr_._1_7_,local_58.ss_.ptr_._0_1_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58.ss_.ptr_._0_1_ = 0x62;
  local_50.data_._0_1_ = bidfx_public_api::tools::ByteBuffer::GetNextByte();
  testing::internal::CmpHelperEQ<char,unsigned_char>
            (local_48,"\'b\'","byte_buffer.GetNextByte()",(char *)&local_58,(uchar *)&local_50);
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message(&local_58);
    if (local_40.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_40.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0x26,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (CONCAT71(local_58.ss_.ptr_._1_7_,local_58.ss_.ptr_._0_1_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT71(local_58.ss_.ptr_._1_7_,local_58.ss_.ptr_._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_58.ss_.ptr_._1_7_,local_58.ss_.ptr_._0_1_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_38);
  return;
}

Assistant:

TEST(ByteBufferTest, test_two_insertion)
{
    ByteBuffer byte_buffer(12);
    byte_buffer.WriteByte('a');
    byte_buffer.WriteByte('b');
    EXPECT_EQ('a', byte_buffer.GetNextByte());
    EXPECT_EQ('b', byte_buffer.GetNextByte());
}